

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::
PropagateDateTruncStatistics<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::MicrosecondOperator>
          (duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_true> *this_00;
  bool bVar1;
  reference pvVar2;
  timestamp_t tVar3;
  timestamp_t tVar4;
  LogicalType local_110;
  BaseStatistics result;
  Value min_value;
  Value max_value;
  
  this_00 = input->child_stats;
  pvVar2 = vector<duckdb::BaseStatistics,_true>::get<true>(this_00,1);
  bVar1 = NumericStats::HasMinMax(pvVar2);
  if (bVar1) {
    tVar3 = NumericStats::GetMin<duckdb::timestamp_t>(pvVar2);
    tVar4 = NumericStats::GetMax<duckdb::timestamp_t>(pvVar2);
    if (tVar3.value <= tVar4.value) {
      tVar3 = DateTrunc::
              UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::MicrosecondOperator>
                        (tVar3);
      tVar4 = DateTrunc::
              UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::MicrosecondOperator>
                        (tVar4);
      Value::CreateValue<duckdb::timestamp_t>(&min_value,tVar3);
      Value::CreateValue<duckdb::timestamp_t>(&max_value,tVar4);
      LogicalType::LogicalType(&local_110,&min_value.type_);
      NumericStats::CreateEmpty(&result,&local_110);
      LogicalType::~LogicalType(&local_110);
      NumericStats::SetMin(&result,&min_value);
      NumericStats::SetMax(&result,&max_value);
      pvVar2 = vector<duckdb::BaseStatistics,_true>::get<true>(this_00,0);
      BaseStatistics::CopyValidity(&result,pvVar2);
      BaseStatistics::ToUnique((BaseStatistics *)this);
      BaseStatistics::~BaseStatistics(&result);
      Value::~Value(&max_value);
      Value::~Value(&min_value);
      return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDateTruncStatistics(ClientContext &context, FunctionStatisticsInput &input) {
	return DateTruncStatistics<TA, TR, OP>(input.child_stats);
}